

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

string * __thiscall rcg::Device::getUserDefinedName_abi_cxx11_(Device *this)

{
  PDevGetInfo p_Var1;
  void *pvVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  Device *in_RSI;
  string *in_RDI;
  bool bVar6;
  size_t i;
  GC_ERROR err;
  size_t tmp_size;
  char tmp [100];
  INFO_DATATYPE type;
  lock_guard<std::mutex> lock;
  string *ret;
  DEVICE_INFO_CMD in_stack_0000034c;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000350;
  Device *in_stack_00000358;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  lock_guard<std::mutex> *in_stack_fffffffffffffeb0;
  PIFGetDeviceInfo p_Var7;
  string local_f0 [32];
  ulong local_d0;
  int local_94;
  size_t local_90;
  char local_88 [104];
  INFO_DATATYPE local_20;
  undefined1 local_19;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffeb0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_19 = 0;
  std::__cxx11::string::string(in_RDI);
  local_20 = 0;
  local_88[0x50] = '\0';
  local_88[0x51] = '\0';
  local_88[0x52] = '\0';
  local_88[0x53] = '\0';
  local_88[0x54] = '\0';
  local_88[0x55] = '\0';
  local_88[0x56] = '\0';
  local_88[0x57] = '\0';
  local_88[0x58] = '\0';
  local_88[0x59] = '\0';
  local_88[0x5a] = '\0';
  local_88[0x5b] = '\0';
  local_88[0x5c] = '\0';
  local_88[0x5d] = '\0';
  local_88[0x5e] = '\0';
  local_88[0x5f] = '\0';
  local_88[0x40] = '\0';
  local_88[0x41] = '\0';
  local_88[0x42] = '\0';
  local_88[0x43] = '\0';
  local_88[0x44] = '\0';
  local_88[0x45] = '\0';
  local_88[0x46] = '\0';
  local_88[0x47] = '\0';
  local_88[0x48] = '\0';
  local_88[0x49] = '\0';
  local_88[0x4a] = '\0';
  local_88[0x4b] = '\0';
  local_88[0x4c] = '\0';
  local_88[0x4d] = '\0';
  local_88[0x4e] = '\0';
  local_88[0x4f] = '\0';
  local_88[0x30] = '\0';
  local_88[0x31] = '\0';
  local_88[0x32] = '\0';
  local_88[0x33] = '\0';
  local_88[0x34] = '\0';
  local_88[0x35] = '\0';
  local_88[0x36] = '\0';
  local_88[0x37] = '\0';
  local_88[0x38] = '\0';
  local_88[0x39] = '\0';
  local_88[0x3a] = '\0';
  local_88[0x3b] = '\0';
  local_88[0x3c] = '\0';
  local_88[0x3d] = '\0';
  local_88[0x3e] = '\0';
  local_88[0x3f] = '\0';
  local_88[0x20] = '\0';
  local_88[0x21] = '\0';
  local_88[0x22] = '\0';
  local_88[0x23] = '\0';
  local_88[0x24] = '\0';
  local_88[0x25] = '\0';
  local_88[0x26] = '\0';
  local_88[0x27] = '\0';
  local_88[0x28] = '\0';
  local_88[0x29] = '\0';
  local_88[0x2a] = '\0';
  local_88[0x2b] = '\0';
  local_88[0x2c] = '\0';
  local_88[0x2d] = '\0';
  local_88[0x2e] = '\0';
  local_88[0x2f] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_88[0x60] = '\0';
  local_88[0x61] = '\0';
  local_88[0x62] = '\0';
  local_88[99] = '\0';
  local_90 = 100;
  local_94 = -0x3e9;
  pvVar2 = getHandle(in_RSI);
  if (pvVar2 == (void *)0x0) {
    getParent((Device *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    peVar4 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11c828);
    pvVar2 = Interface::getHandle(peVar4);
    std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x11c844);
    if (pvVar2 != (void *)0x0) {
      peVar3 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11c861);
      p_Var7 = peVar3->IFGetDeviceInfo;
      getParent((Device *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      peVar4 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11c88e);
      pvVar2 = Interface::getHandle(peVar4);
      getID_abi_cxx11_(in_RSI);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_94 = (*p_Var7)(pvVar2,pcVar5,6,&local_20,local_88,&local_90);
      std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x11c8f9);
    }
  }
  else {
    peVar3 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11c792);
    p_Var1 = peVar3->DevGetInfo;
    pvVar2 = getHandle(in_RSI);
    local_94 = (*p_Var1)(pvVar2,6,&local_20,local_88,&local_90);
  }
  if ((local_94 == 0) && (local_20 == 1)) {
    local_d0 = 0;
    while( true ) {
      bVar6 = false;
      if (local_d0 < local_90) {
        bVar6 = local_88[local_d0] != '\0';
      }
      if (!bVar6) break;
      std::__cxx11::string::push_back((char)in_RDI);
      local_d0 = local_d0 + 1;
    }
  }
  else {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (in_stack_00000358,in_stack_00000350,in_stack_0000034c);
    std::__cxx11::string::operator=(in_RDI,local_f0);
    std::__cxx11::string::~string(local_f0);
  }
  local_19 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11ca3e);
  return in_RDI;
}

Assistant:

std::string Device::getUserDefinedName()
{
  std::lock_guard<std::mutex> lock(mtx);
  std::string ret;

  // try to get user defined name

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[100]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (getHandle() != 0)
  {
    err=gentl->DevGetInfo(getHandle(), GenTL::DEVICE_INFO_USER_DEFINED_NAME, &type, tmp,
      &tmp_size);
  }
  else if (getParent()->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(getParent()->getHandle(), getID().c_str(),
      GenTL::DEVICE_INFO_USER_DEFINED_NAME, &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }
  else
  {
    // since user defined name is optional, fall back to display name in case
    // of an error

    ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_DISPLAYNAME);
  }

  return ret;
}